

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::parse_number
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_visitor<wchar_t> *visitor,error_code *ec)

{
  (*(code *)(&DAT_006b686c + *(int *)(&DAT_006b686c + (ulong)this->number_state_ * 4)))();
  return;
}

Assistant:

void parse_number(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        const char_type* local_input_end = end_input_;

        switch (number_state_)
        {
            case parse_number_state::minus:
                goto minus_sign;
            case parse_number_state::zero:
                goto zero;
            case parse_number_state::integer:
                goto integer;
            case parse_number_state::fraction1:
                goto fraction1;
            case parse_number_state::fraction2:
                goto fraction2;
            case parse_number_state::exp1:
                goto exp1;
            case parse_number_state::exp2:
                goto exp2;
            case parse_number_state::exp3:
                goto exp3;
            default:
                JSONCONS_UNREACHABLE();               
        }
minus_sign:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::minus;
            return;
        }
        switch (*input_ptr_)
        {
            case '0': 
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto zero;
            case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto integer;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::expected_value;
                more_ = false;
                return;
        }
zero:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::zero;
            return;
        }
        switch (*input_ptr_)
        {
            case '\r': 
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                push_state(state_);
                state_ = parse_state::cr;
                return; 
            case '\n': 
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++line_;
                ++position_;
                mark_position_ = position_;
                return;   
            case ' ':case '\t':
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                skip_space(&input_ptr_);
                return;
            case '/': 
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                push_state(state_);
                state_ = parse_state::slash;
                return;
            case '}':
            case ']':
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                state_ = parse_state::expect_comma_or_end;
                return;
            case '.':
                string_buffer_.push_back(to_double_.get_decimal_point());
                ++input_ptr_;
                ++position_;
                goto fraction1;
            case 'e':case 'E':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp1;
            case ',':
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                begin_member_or_element(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                return;
            case '0': case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                err_handler_(json_errc::leading_zero, *this);
                ec = json_errc::leading_zero;
                more_ = false;
                number_state_ = parse_number_state::zero;
                return;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::invalid_number;
                more_ = false;
                number_state_ = parse_number_state::zero;
                return;
        }
integer:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::integer;
            return;
        }
        switch (*input_ptr_)
        {
            case '\r': 
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                push_state(state_);
                ++input_ptr_;
                ++position_;
                state_ = parse_state::cr;
                return; 
            case '\n': 
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++line_;
                ++position_;
                mark_position_ = position_;
                return;   
            case ' ':case '\t':
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                skip_space(&input_ptr_);
                return;
            case '/': 
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                push_state(state_);
                ++input_ptr_;
                ++position_;
                state_ = parse_state::slash;
                return;
            case '}':
            case ']':
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                state_ = parse_state::expect_comma_or_end;
                return;
            case '0': case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto integer;
            case '.':
                string_buffer_.push_back(to_double_.get_decimal_point());
                ++input_ptr_;
                ++position_;
                goto fraction1;
            case 'e':case 'E':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp1;
            case ',':
                end_integer_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                begin_member_or_element(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                return;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::invalid_number;
                more_ = false;
                number_state_ = parse_number_state::integer;
                return;
        }
fraction1:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::fraction1;
            return;
        }
        switch (*input_ptr_)
        {
            case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto fraction2;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::invalid_number;
                more_ = false;
                number_state_ = parse_number_state::fraction1;
                return;
        }
fraction2:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::fraction2;
            return;
        }
        switch (*input_ptr_)
        {
            case '\r': 
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                push_state(state_);
                ++input_ptr_;
                ++position_;
                state_ = parse_state::cr;
                return; 
            case '\n': 
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++line_;
                ++position_;
                mark_position_ = position_;
                return;   
            case ' ':case '\t':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                skip_space(&input_ptr_);
                return;
            case '/': 
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                push_state(state_);
                ++input_ptr_;
                ++position_;
                state_ = parse_state::slash;
                return;
            case '}':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                state_ = parse_state::expect_comma_or_end;
                return;
            case ']':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                state_ = parse_state::expect_comma_or_end;
                return;
            case ',':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                begin_member_or_element(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                return;
            case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto fraction2;
            case 'e':case 'E':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp1;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::invalid_number;
                more_ = false;
                number_state_ = parse_number_state::fraction2;
                return;
        }
exp1:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::exp1;
            return;
        }
        switch (*input_ptr_)
        {
            case '+':
                ++input_ptr_;
                ++position_;
                goto exp2;
            case '-':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp2;
            case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp3;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::expected_value;
                more_ = false;
                number_state_ = parse_number_state::exp1;
                return;
        }
exp2:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::exp2;
            return;
        }
        switch (*input_ptr_)
        {
            case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp3;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::expected_value;
                more_ = false;
                number_state_ = parse_number_state::exp2;
                return;
        }
        
exp3:
        if (JSONCONS_UNLIKELY(input_ptr_ >= local_input_end)) // Buffer exhausted               
        {
            number_state_ = parse_number_state::exp3;
            return;
        }
        switch (*input_ptr_)
        {
            case '\r': 
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                push_state(state_);
                state_ = parse_state::cr;
                return; 
            case '\n': 
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++line_;
                ++position_;
                mark_position_ = position_;
                return;   
            case ' ':case '\t':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                skip_space(&input_ptr_);
                return;
            case '/': 
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                push_state(state_);
                ++input_ptr_;
                ++position_;
                state_ = parse_state::slash;
                return;
            case '}':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                state_ = parse_state::expect_comma_or_end;
                return;
            case ']':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                state_ = parse_state::expect_comma_or_end;
                return;
            case ',':
                end_fraction_value(visitor, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                begin_member_or_element(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                ++input_ptr_;
                ++position_;
                return;
            case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8': case '9':
                string_buffer_.push_back(static_cast<char>(*input_ptr_));
                ++input_ptr_;
                ++position_;
                goto exp3;
            default:
                err_handler_(json_errc::invalid_number, *this);
                ec = json_errc::invalid_number;
                more_ = false;
                number_state_ = parse_number_state::exp3;
                return;
        }

        JSONCONS_UNREACHABLE();               
    }